

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void mouse_button_callback(GLFWwindow *window,wchar_t button,wchar_t action,wchar_t mods)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = counter;
  if (button == L'\0') {
    pcVar3 = "left";
  }
  else if (button == L'\x02') {
    pcVar3 = "middle";
  }
  else {
    if (button != L'\x01') {
      bVar1 = true;
      pcVar3 = (char *)0x0;
      goto LAB_00107008;
    }
    pcVar3 = "right";
  }
  bVar1 = false;
LAB_00107008:
  counter = counter + 1;
  glfwGetTime();
  printf("%08x at %0.3f: Mouse button %i",(ulong)uVar2,(ulong)(uint)button);
  if (!bVar1) {
    printf(" (%s)",pcVar3);
  }
  if (mods != L'\0') {
    get_mods_name(mods);
    printf(" (with%s)",get_mods_name::name);
  }
  if ((uint)action < 3) {
    pcVar3 = (&PTR_anon_var_dwarf_2f0_00114d20)[(uint)action];
  }
  else {
    pcVar3 = "caused unknown action";
  }
  printf(" was %s\n",pcVar3);
  return;
}

Assistant:

static void mouse_button_callback(GLFWwindow* window, int button, int action, int mods)
{
    const char* name = get_button_name(button);

    printf("%08x at %0.3f: Mouse button %i", counter++, glfwGetTime(), button);

    if (name)
        printf(" (%s)", name);

    if (mods)
        printf(" (with%s)", get_mods_name(mods));

    printf(" was %s\n", get_action_name(action));
}